

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O2

void Gia_ManCollapseDeref(DdManager *dd,Vec_Ptr_t *vFuncs)

{
  DdNode *n;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < vFuncs->nSize; i_00 = i_00 + 1) {
    n = (DdNode *)Vec_PtrEntry(vFuncs,i_00);
    if (n != (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,n);
    }
  }
  Vec_PtrFree(vFuncs);
  return;
}

Assistant:

void Gia_ManCollapseDeref( DdManager * dd, Vec_Ptr_t * vFuncs )
{
    DdNode * bFunc; int i;
    Vec_PtrForEachEntry( DdNode *, vFuncs, bFunc, i )
        if ( bFunc )
            Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vFuncs );
}